

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fInstancedRenderingTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::InstancedRenderingCase::~InstancedRenderingCase
          (InstancedRenderingCase *this)

{
  InstancedRenderingCase *this_local;
  
  ~InstancedRenderingCase(this);
  operator_delete(this,0x120);
  return;
}

Assistant:

InstancedRenderingCase::~InstancedRenderingCase (void)
{
	InstancedRenderingCase::deinit();
}